

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DC16_C(uint8_t *dst)

{
  long in_RDI;
  int j;
  int DC;
  uint8_t *in_stack_ffffffffffffffe8;
  undefined4 local_10;
  int v;
  
  v = 0x10;
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    v = (uint)*(byte *)(in_RDI + (local_10 * 0x20 + -1)) +
        (uint)*(byte *)(in_RDI + (local_10 + -0x20)) + v;
  }
  Put16(v,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void DC16_C(uint8_t* dst) {    // DC
  int DC = 16;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS] + dst[j - BPS];
  }
  Put16(DC >> 5, dst);
}